

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O3

void __thiscall
amrex::PODVector<double,_std::allocator<double>_>::PODVector
          (PODVector<double,_std::allocator<double>_> *this,size_type a_size,
          value_type_conflict2 *a_value,allocator_type *a_allocator)

{
  value_type_conflict2 vVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  this->m_data = (pointer)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  if (a_size < 9) {
    AllocateBuffer(this,8);
    this->m_size = a_size;
    if (a_size == 0) {
      return;
    }
  }
  else {
    uVar6 = 8;
    do {
      uVar6 = uVar6 * 3 + 1 >> 1;
    } while (uVar6 < a_size);
    AllocateBuffer(this,uVar6);
    this->m_size = a_size;
  }
  auVar4 = _DAT_0074fb40;
  auVar3 = _DAT_0074fb30;
  pdVar2 = this->m_data;
  vVar1 = *a_value;
  uVar6 = a_size + 0x1fffffffffffffff & 0x1fffffffffffffff;
  auVar7._8_4_ = (int)uVar6;
  auVar7._0_8_ = uVar6;
  auVar7._12_4_ = (int)(uVar6 >> 0x20);
  lVar5 = 0;
  auVar7 = auVar7 ^ _DAT_0074fb40;
  do {
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8 = (auVar8 | auVar3) ^ auVar4;
    if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                auVar7._4_4_ < auVar8._4_4_) & 1)) {
      pdVar2[lVar5] = vVar1;
    }
    if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
        auVar8._12_4_ <= auVar7._12_4_) {
      pdVar2[lVar5 + 1] = vVar1;
    }
    lVar5 = lVar5 + 2;
  } while ((uVar6 - ((uint)(a_size + 0x1fffffffffffffff) & 1)) + 2 != lVar5);
  return;
}

Assistant:

PODVector (size_type a_size, const value_type& a_value,
                   const allocator_type& a_allocator = Allocator()) noexcept
            : Allocator(a_allocator), m_data(nullptr), m_size(0), m_capacity(0)
        {
            AllocateBuffer(GetNewCapacity(a_size));
            m_size = a_size;
            detail::uninitializedFillNImpl<Allocator>(m_data, a_size, a_value, *this);
        }